

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void changeWindowState(_GLFWwindow *window,Atom state,wchar_t action)

{
  XEvent event;
  undefined4 local_e0 [8];
  Window local_c0;
  Atom local_b8;
  undefined4 local_b0;
  ulong local_a8;
  Atom local_a0;
  undefined8 local_98;
  undefined8 local_90;
  
  memset(local_e0,0,0xc0);
  local_e0[0] = 0x21;
  local_c0 = (window->x11).handle;
  local_b0 = 0x20;
  local_b8 = _glfw.x11.NET_WM_STATE;
  local_a8 = (ulong)(uint)action;
  local_98 = 0;
  local_90 = 1;
  local_a0 = state;
  XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,local_e0);
  return;
}

Assistant:

static void changeWindowState(_GLFWwindow* window, Atom state, int action)
{
    XEvent event;
    memset(&event, 0, sizeof(event));

    event.type = ClientMessage;
    event.xclient.window = window->x11.handle;
    event.xclient.format = 32; // Data is 32-bit longs
    event.xclient.message_type = _glfw.x11.NET_WM_STATE;
    event.xclient.data.l[0] = action;
    event.xclient.data.l[1] = state;
    event.xclient.data.l[2] = 0; // No secondary property
    event.xclient.data.l[3] = 1; // Sender is a normal application

    XSendEvent(_glfw.x11.display,
               _glfw.x11.root,
               False,
               SubstructureNotifyMask | SubstructureRedirectMask,
               &event);
}